

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O2

double __thiscall chrono::fea::ChElementShellANCF_3833::GetDensity(ChElementShellANCF_3833 *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int kl;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  auVar5 = ZEXT816(0) << 0x40;
  lVar3 = 0;
  lVar4 = 0;
  while (lVar4 < this->m_numLayers) {
    std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,
               (__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_material).
                       super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + lVar3));
    dVar1 = (local_38._M_ptr)->m_rho;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    auVar5._8_8_ = 0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar1;
    lVar4 = lVar4 + 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)((long)&((this->m_layers).
                                      super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_thickness +
                             lVar3);
    auVar5 = vfmadd231sd_fma(auVar5,auVar6,auVar2);
    lVar3 = lVar3 + 0x20;
  }
  return auVar5._0_8_ / this->m_thicknessZ;
}

Assistant:

double ChElementShellANCF_3833::GetDensity() {
    double tot_density = 0;
    for (int kl = 0; kl < m_numLayers; kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();
        double layerthick = m_layers[kl].Get_thickness();
        tot_density += rho * layerthick;
    }
    return tot_density / m_thicknessZ;
}